

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O3

void cast_verify::InitializeCastArray<float>(CastTest<float> *tests,size_t cTests)

{
  size_t sVar1;
  
  if (cTests != 0) {
    sVar1 = 0;
    do {
      switch(sVar1) {
      case 0:
        tests->x = 1.8446744e+19;
        tests->fExpected = false;
        break;
      case 1:
        tests[1].x = 9.223372e+18;
        tests[1].fExpected = true;
        break;
      case 2:
        tests[2].x = 0.0;
        tests[2].fExpected = true;
        break;
      case 3:
        tests[3].x = -0.0;
        tests[3].fExpected = true;
        break;
      case 4:
        tests[4].x = -0.01;
        tests[4].fExpected = false;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/CastVerify.cpp"
                      ,0x32,
                      "void cast_verify::InitializeCastArray(CastTest<T> *, size_t) [T = float]");
      }
      sVar1 = sVar1 + 1;
    } while (cTests != sVar1);
  }
  return;
}

Assistant:

void InitializeCastArray(CastTest<T>* tests, size_t cTests)
	{
		for (unsigned long i = 0; i < cTests; ++i)
		{
			switch (i)
			{
			case 0:
				tests[i].x = static_cast<T>(pow(2, 64));
				tests[i].fExpected = false;
				break;
			case 1:
				tests[i].x = static_cast<T>(pow(2, 63));
				tests[i].fExpected = true;
				break;
			case 2:
				tests[i].x = 0;
				tests[i].fExpected = true;
				break;
			case 3:
				// This is peculiar, but (-0.0 < 0.0) == false
				tests[i].x = -0.0;
				tests[i].fExpected = true;
				break;
			case 4:
				tests[i].x = static_cast<T>(-0.01);
				tests[i].fExpected = false;
				break;
			default:
				assert(false);
				break;
			}
		}
	}